

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfunction.h
# Opt level: O0

void __thiscall
TPZDummyFunction<double>::TPZDummyFunction
          (TPZDummyFunction<double> *this,_func_void_TPZVec<double>_ptr_TPZVec<double>_ptr *FuncPtr,
          int polynomialorder)

{
  undefined4 in_EDX;
  TPZFunction<double> in_RSI;
  TPZFunction<double> *in_RDI;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZDummyFunction<double>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_023d12f0);
  TPZFunction<double>::TPZFunction(in_RDI,&PTR_PTR_023d12d8);
  *in_RDI = (TPZFunction<double>)&PTR__TPZDummyFunction_023d1250;
  *in_RDI = (TPZFunction<double>)&PTR__TPZDummyFunction_023d1250;
  in_RDI[1] = in_RSI;
  in_RDI[2] = (TPZFunction<double>)0x0;
  in_RDI[3] = (TPZFunction<double>)0x0;
  *(undefined4 *)(in_RDI + 4) = in_EDX;
  return;
}

Assistant:

TPZDummyFunction(void (*FuncPtr)(const TPZVec<REAL> &x, TPZVec<TVar> &val), int polynomialorder )
    : TPZRegisterClassId(&TPZDummyFunction::ClassId)
    {
        fFunc = FuncPtr;
		fFunc2 = 0;
		fFunc3 = 0;
		fPorder = polynomialorder;
    }